

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O0

error __thiscall image::clamp(image *this,context *ctx,token *token,opcode *op)

{
  undefined8 this_00;
  bool bVar1;
  unsigned_long uVar2;
  optional<unsigned_long> oVar3;
  int local_74;
  token local_70;
  string_view local_48;
  _Storage<unsigned_long,_true> local_38;
  optional<unsigned_long> result;
  opcode *op_local;
  token *token_local;
  context *ctx_local;
  
  result.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = op;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,".");
  oVar3 = find_in_table(token,clamp::table,local_48);
  local_38._M_value =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  result.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged;
  bVar1 = std::optional::operator_cast_to_bool((optional *)&local_38);
  if (bVar1) {
    context::tokenize(&local_70,ctx);
    memcpy(token,&local_70,0x24);
  }
  this_00 = result.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._8_8_;
  local_74 = 1;
  uVar2 = std::optional<unsigned_long>::value_or<int>
                    ((optional<unsigned_long> *)&local_38,&local_74);
  opcode::add_bits((opcode *)this_00,uVar2 << 0x31);
  memset(this,0,8);
  error::error((error *)this);
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)this;
}

Assistant:

DEFINE_OPERAND(s2r)
{
    static const char* table[] = {
        "SR_LANEID",
        "SR_CLOCK",
        "SR_VIRTCFG",
        "SR_VIRTID",
        "SR_PM0",
        "SR_PM1",
        "SR_PM2",
        "SR_PM3",
        "SR_PM4",
        "SR_PM5",
        "SR_PM6",
        "SR_PM7",
        "SR12",
        "SR13",
        "SR14",
        "SR_ORDERING_TICKET",
        "SR_PRIM_TYPE",
        "SR_INVOCATION_ID",
        "SR_Y_DIRECTION",
        "SR_THREAD_KILL",
        "SM_SHADER_TYPE",
        "SR_DIRECTCBEWRITEADDRESSLOW",
        "SR_DIRECTCBEWRITEADDRESSHIGH",
        "SR_DIRECTCBEWRITEENABLED",
        "SR_MACHINE_ID_0",
        "SR_MACHINE_ID_1",
        "SR_MACHINE_ID_2",
        "SR_MACHINE_ID_3",
        "SR_AFFINITY",
        "SR_INVOCATION_INFO",
        "SR_WSCALEFACTOR_XY",
        "SR_WSCALEFACTOR_Z",
        "", // SR_TID
        "", // SR_TID.X
        "", // SR_TID.Y
        "", // SR_TID.Z
        "SR_CTA_PARAM",
        "", // SR_CTAID.X
        "", // SR_CTAID.Y
        "", // SR_CTAID.Z
        "SR_NTID",
        "SR_CirQueueIncrMinusOne",
        "SR_NLATC",
        "SR43",
        "SR_SM_SPA_VERSION",
        "SR_MULTIPASSSHADERINFO",
        "SR_LWINHI",
        "SR_SWINHI",
        "SR_SWINLO",
        "SR_SWINSZ",
        "SR_SMEMSZ",
        "SR_SMEMBANKS",
        "SR_LWINLO",
        "SR_LWINSZ",
        "SR_LMEMLOSZ",
        "SR_LMEMHIOFF",
        "SR_EQMASK",
        "SR_LTMASK",
        "SR_LEMASK",
        "SR_GTMASK",
        "SR_GEMASK",
        "SR_REGALLOC",
        "SR_BARRIERALLOC",
        "SR63",
        "SR_GLOBALERRORSTATUS",
        "SR65",
        "SR_WARPERRORSTATUS",
        "SR_WARPERRORSTATUSCLEAR",
        "SR68",
        "SR69",
        "SR70",
        "SR71",
        "SR_PM_HI0",
        "SR_PM_HI1",
        "SR_PM_HI2",
        "SR_PM_HI3",
        "SR_PM_HI4",
        "SR_PM_HI5",
        "SR_PM_HI6",
        "SR_PM_HI7",
        "SR_CLOCKLO",
        "SR_CLOCKHI",
        "SR_GLOBALTIMERLO",
        "SR_GLOBALTIMERHI",
        "SR84",
        "SR85",
        "SR86",
        "SR87",
        "SR88",
        "SR89",
        "SR90",
        "SR91",
        "SR92",
        "SR93",
        "SR94",
        "SR95",
        "SR_HWTASKID",
        "SR_CIRCULARQUEUEENTRYINDEX",
        "SR_CIRCULARQUEUEENTRYADDRESSLOW",
        "SR_CIRCULARQUEUEENTRYADDRESSHIGH",
        "SR100",
        "SR101",
        "SR102",
        "SR103",
        "SR104",
        "SR105",
        "SR106",
        "SR107",
        "SR108",
        "SR109",
        "SR110",
        "SR111",
        "SR112",
        "SR113",
        "SR114",
        "SR115",
        "SR116",
        "SR117",
        "SR118",
        "SR119",
        "SR120",
        "SR121",
        "SR122",
        "SR123",
        "SR124",
        "SR125",
        "SR126",
        "SR127",
        "SR128",
        "SR129",
        "SR130",
        "SR131",
        "SR132",
        "SR133",
        "SR134",
        "SR135",
        "SR136",
        "SR137",
        "SR138",
        "SR139",
        "SR140",
        "SR141",
        "SR142",
        "SR143",
        "SR144",
        "SR145",
        "SR146",
        "SR147",
        "SR148",
        "SR149",
        "SR150",
        "SR151",
        "SR152",
        "SR153",
        "SR154",
        "SR155",
        "SR156",
        "SR157",
        "SR158",
        "SR159",
        "SR160",
        "SR161",
        "SR162",
        "SR163",
        "SR164",
        "SR165",
        "SR166",
        "SR167",
        "SR168",
        "SR169",
        "SR170",
        "SR171",
        "SR172",
        "SR173",
        "SR174",
        "SR175",
        "SR176",
        "SR177",
        "SR178",
        "SR179",
        "SR180",
        "SR181",
        "SR182",
        "SR183",
        "SR184",
        "SR185",
        "SR186",
        "SR187",
        "SR188",
        "SR189",
        "SR190",
        "SR191",
        "SR192",
        "SR193",
        "SR194",
        "SR195",
        "SR196",
        "SR197",
        "SR198",
        "SR199",
        "SR200",
        "SR201",
        "SR202",
        "SR203",
        "SR204",
        "SR205",
        "SR206",
        "SR207",
        "SR208",
        "SR209",
        "SR210",
        "SR211",
        "SR212",
        "SR213",
        "SR214",
        "SR215",
        "SR216",
        "SR217",
        "SR218",
        "SR219",
        "SR220",
        "SR221",
        "SR222",
        "SR223",
        "SR224",
        "SR225",
        "SR226",
        "SR227",
        "SR228",
        "SR229",
        "SR230",
        "SR231",
        "SR232",
        "SR233",
        "SR234",
        "SR235",
        "SR236",
        "SR237",
        "SR238",
        "SR239",
        "SR240",
        "SR241",
        "SR242",
        "SR243",
        "SR244",
        "SR245",
        "SR246",
        "SR247",
        "SR248",
        "SR249",
        "SR250",
        "SR251",
        "SR252",
        "SR253",
        "SR254",
        "SR255",
        nullptr,
    };

    std::optional<uint64_t> value;
    if (equal(token, "SR_TID")) {
        token = ctx.tokenize();
        if (equal(token, ".X")) {
            value = 33;
        } else if (equal(token, ".Y")) {
            value = 34;
        } else if (equal(token, ".Z")) {
            value = 35;
        } else {
            value = 32;
        }
        if (value != 32) {
            token = ctx.tokenize();
        }
    } else if (equal(token, "SR_CTAID")) {
        token = ctx.tokenize();
        if (equal(token, ".X")) {
            value = 37;
        } else if (equal(token, ".Y")) {
            value = 38;
        } else if (equal(token, ".Z")) {
            value = 39;
        } else {
            return fail(token, "expected .X, .Y or .Z after SR_CTAID");
        }
        token = ctx.tokenize();
    } else {
        value = find_in_table(token, table, "");
        if (!value) {
            return fail(token, "invalid system register \33[1m%.*s\33[0m",
                        static_cast<int>(token.data.string.size()), token.data.string.data());
        }
        token = ctx.tokenize();
    }
    op.add_bits(*value << 20);
    return {};
}